

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec_normal.cpp
# Opt level: O1

void * mpp_dec_parser_thread(void *data)

{
  int *piVar1;
  HalTaskInfo *task_00;
  MppDecImpl *pMVar2;
  MppBufSlots pvVar3;
  HalTaskGroup pvVar4;
  list_head *plVar5;
  MppPort port;
  MppDec pvVar6;
  MppBufferGroup group;
  MppBufferGroup *group_00;
  pthread_mutex_t *__mutex;
  MppThreadStatus MVar7;
  MPP_RET MVar8;
  MPP_RET MVar9;
  RK_S32 RVar10;
  RK_U32 RVar11;
  RK_U32 RVar12;
  MppFrameFormat MVar13;
  MppBuffer pvVar14;
  RK_S64 RVar15;
  size_t sVar16;
  void *data_00;
  list_head *plVar17;
  list_head *plVar18;
  ushort uVar19;
  int iVar20;
  RK_U32 i;
  long lVar21;
  uint uVar22;
  MppThread *pMVar23;
  undefined4 index_00;
  pthread_mutex_t *__mutex_00;
  MppDecImpl *dec;
  bool bVar24;
  MppTask mpp_task;
  RK_S32 index;
  MppBuffer hal_buf_in;
  MppBuffer hal_buf_out;
  DecTask task;
  size_t in_stack_fffffffffffffe68;
  MppTask local_188;
  MppBufSlots local_180;
  MppBufSlots local_178;
  MppPacket local_170;
  MppBuffer local_168;
  MppBuffer local_160;
  DecTask local_158;
  MppBufferGroup *local_98;
  MppThread *local_90;
  pthread_mutex_t *local_88;
  Mpp *local_80;
  HalTaskGroup local_78;
  MppBufSlots local_70;
  MppDecImpl *local_68;
  sem_t *local_60;
  pthread_mutex_t *local_58;
  sem_t *local_50;
  void **local_48;
  sem_t *local_40;
  pthread_cond_t *local_38;
  
  dec = *(MppDecImpl **)((long)data + 0xa8);
  pMVar23 = dec->thread_parser;
  local_70 = dec->packet_slots;
  dec_task_init(&local_158);
  mpp_clock_start(dec->clocks[0]);
  __mutex_00 = (pthread_mutex_t *)pMVar23->mMutexCond;
  pthread_mutex_lock(__mutex_00);
  MVar7 = MppThread::get_status(pMVar23,THREAD_WORK);
  bVar24 = MVar7 == MPP_THREAD_RUNNING;
  if (bVar24) {
    local_38 = (pthread_cond_t *)&pMVar23->mMutexCond[0].mCondition;
    local_40 = (sem_t *)&dec->cmd_start;
    local_48 = &dec->param;
    local_50 = (sem_t *)&dec->cmd_done;
    local_58 = (pthread_mutex_t *)(pMVar23->mMutexCond + 3);
    local_60 = (sem_t *)&dec->parser_reset;
    local_98 = (MppBufferGroup *)((long)data + 0x40);
    local_90 = pMVar23;
    local_88 = __mutex_00;
    local_80 = (Mpp *)data;
    local_68 = dec;
    do {
      MVar8 = check_task_wait(dec,&local_158);
      if (MVar8 != MPP_OK) {
        mpp_clock_start(dec->clocks[1]);
        MVar7 = pMVar23->mStatus[0];
        pMVar23->mStatus[0] = MPP_THREAD_WAITING;
        pthread_cond_wait(local_38,__mutex_00);
        if (pMVar23->mStatus[0] == MPP_THREAD_WAITING) {
          pMVar23->mStatus[0] = MVar7;
        }
        mpp_clock_pause(dec->clocks[1]);
      }
      pthread_mutex_unlock(__mutex_00);
      if (!bVar24) goto LAB_00147884;
      if (dec->cmd_send == dec->cmd_recv) {
        if (dec->reset_flag == 0) {
          mpp_clock_start(dec->clocks[2]);
          pMVar2 = (MppDecImpl *)((Mpp *)data)->mDec;
          pvVar4 = pMVar2->tasks;
          local_180 = pMVar2->frame_slots;
          local_178 = pMVar2->packet_slots;
          local_168 = (void *)0x0;
          local_160 = (void *)0x0;
          if (local_158.hnd == (HalTaskHnd)0x0) {
            hal_task_get_hnd(pvVar4,0,&local_158.hnd);
            if (local_158.hnd != (HalTaskHnd)0x0) {
              local_158.wait.val = local_158.wait.val & 0xfffffeff;
              goto LAB_00146bee;
            }
            local_158.wait.val = local_158.wait.val | 0x100;
          }
          else {
LAB_00146bee:
            local_78 = pvVar4;
            if ((pMVar2->mpp_pkt_in == (MppPacket)0x0) && ((local_158.status.val & 0x100) == 0)) {
              port = ((Mpp *)data)->mMppInPort;
              pvVar6 = ((Mpp *)data)->mDec;
              local_188 = (MppBuffer)0x0;
              local_170 = (MppPacket)0x0;
              MVar8 = _mpp_port_poll("try_get_input_packet",port,MPP_POLL_NON_BLOCK);
              if (MVar8 < MPP_OK) {
                local_158.wait.val = local_158.wait.val | 1;
              }
              else {
                MVar9 = _mpp_port_dequeue("try_get_input_packet",port,&local_188);
                if ((MVar9 != MPP_OK) || (local_188 == (MppBuffer)0x0)) {
                  in_stack_fffffffffffffe68 =
                       CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x12a);
                  _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "ret == MPP_OK && mpp_task","try_get_input_packet",
                             in_stack_fffffffffffffe68);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147948;
                }
                mpp_task_meta_get_packet(local_188,KEY_INPUT_PACKET,&local_170);
                if (local_170 == (MppPacket)0x0) {
                  in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),300)
                  ;
                  _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"packet",
                             "try_get_input_packet",in_stack_fffffffffffffe68);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147948;
                }
                pvVar14 = mpp_packet_get_buffer(local_170);
                if (pvVar14 == (MppBuffer)0x0) {
                  _mpp_port_enqueue("try_get_input_packet",port,local_188);
                }
                *(MppPacket *)((long)pvVar6 + 0x208) = local_170;
                ((Mpp *)data)->mPacketGetCount = ((Mpp *)data)->mPacketGetCount + 1;
                piVar1 = (int *)((long)pvVar6 + 0x280);
                *piVar1 = *piVar1 + 1;
                local_158.status.val = local_158.status.val | 2;
                local_158.wait.val = local_158.wait.val & 0xfffffffe;
              }
              pMVar23 = local_90;
              if (MVar8 < MPP_OK) goto LAB_0014784a;
              if (pMVar2->mpp_pkt_in == (MppPacket)0x0) {
                in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x15c)
                ;
                _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "dec->mpp_pkt_in","try_proc_dec_task",in_stack_fffffffffffffe68);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147948;
              }
              if (((byte)mpp_dec_debug & 0x20) != 0) {
                RVar15 = mpp_packet_get_pts(pMVar2->mpp_pkt_in);
                in_stack_fffffffffffffe68 = mpp_packet_get_length(pMVar2->mpp_pkt_in);
                _mpp_log_l(4,"mpp_dec","detail: %p get pkt pts %llu len %d\n","try_proc_dec_task",
                           pMVar2,RVar15,in_stack_fffffffffffffe68);
              }
            }
            if ((local_158.status.val & 0x100) == 0) {
              if (((byte)mpp_debug & 2) != 0) {
                RVar15 = mpp_packet_get_pts(pMVar2->mpp_pkt_in);
                _mpp_log_l(4,"mpp_dec","input packet pts %lld\n",(char *)0x0,RVar15);
              }
              mpp_clock_start(pMVar2->clocks[3]);
              mpp_parser_prepare(pMVar2->parser,pMVar2->mpp_pkt_in,&local_158.info.dec);
              mpp_clock_pause(pMVar2->clocks[3]);
              if (((pMVar2->cfg).base.sort_pts != 0) && (local_158.info.dec.valid != 0)) {
                local_158.ts_cur.pts = mpp_packet_get_pts(pMVar2->mpp_pkt_in);
                local_158.ts_cur.dts = mpp_packet_get_dts(pMVar2->mpp_pkt_in);
              }
              dec_release_input_packet(pMVar2,0);
            }
            local_158.status.val._0_2_ =
                 (ushort)local_158.status.val & 0xfeff |
                 (ushort)((local_158.info.dec.valid & 1) << 8);
            if ((local_158.info.dec.valid == 0 & local_158.info._8_1_) == 1) {
              mpp_dec_put_task((Mpp *)data,&local_158);
            }
            if ((local_158.status.val & 0x100) != 0) {
              if (local_158.info.dec.input_packet == (MppPacket)0x0) {
                in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x196)
                ;
                _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                           "task_dec->input_packet","try_proc_dec_task",in_stack_fffffffffffffe68);
                if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147948;
              }
              if (local_158.info.dec.input < 0) {
                mpp_buf_slot_get_unused(local_178,&local_158.info.dec.input);
              }
              local_158.wait.val._0_2_ =
                   (ushort)local_158.wait.val & 0xefff |
                   (ushort)((uint)local_158.info._44_4_ >> 0x13) & 0x1000;
              if (-1 < local_158.info.dec.input) {
                sVar16 = mpp_packet_get_size(local_158.info.dec.input_packet);
                mpp_buf_slot_get_prop(local_178,local_158.info.dec.input,SLOT_BUFFER,&local_168);
                if (local_168 == (void *)0x0) {
                  mpp_buffer_get_with_tag
                            (((Mpp *)data)->mPacketGroup,&local_168,sVar16,"mpp_dec",
                             "try_proc_dec_task");
                  if (local_168 != (void *)0x0) {
                    mpp_buf_slot_set_prop(local_178,local_158.info.dec.input,SLOT_BUFFER,local_168);
                    mpp_buffer_attach_dev_f("try_proc_dec_task",local_168,pMVar2->dev);
                    mpp_buffer_put_with_caller(local_168,"try_proc_dec_task");
                  }
                }
                else if (*(ulong *)((long)local_168 + 0x88) < sVar16) {
                  in_stack_fffffffffffffe68 =
                       CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x1b2);
                  _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                             "buf->info.size >= stream_size","try_proc_dec_task",
                             in_stack_fffffffffffffe68);
                  if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147948;
                }
                local_158.wait.val._0_2_ =
                     (ushort)local_158.wait.val & 0xdfff | (ushort)(local_168 == (void *)0x0) << 0xd
                ;
                if (local_168 != (void *)0x0) {
                  if ((local_158.status.val & 0x20) == 0) {
                    data_00 = mpp_packet_get_data(local_158.info.dec.input_packet);
                    sVar16 = mpp_packet_get_length(local_158.info.dec.input_packet);
                    mpp_buffer_write_with_caller(local_168,0,data_00,sVar16,"try_proc_dec_task");
                    mpp_buffer_sync_partial_end_f(local_168,0,0,(RK_U32)sVar16,"try_proc_dec_task");
                    pvVar3 = local_178;
                    mpp_buf_slot_set_flag(local_178,local_158.info.dec.input,SLOT_CODEC_READY);
                    mpp_buf_slot_set_flag(pvVar3,local_158.info.dec.input,SLOT_HAL_INPUT);
                    local_158.status.val = local_158.status.val | 0x20;
                  }
                  if ((pMVar2->parser_fast_mode == 0) && ((local_158.status.val & 0x40) == 0)) {
                    local_188 = (HalTaskHnd)0x0;
                    hal_task_get_hnd(local_78,2,&local_188);
                    if (local_188 == (HalTaskHnd)0x0) {
                      local_158.wait.val = local_158.wait.val | 0x200;
                      goto LAB_0014784a;
                    }
                    local_158.status.val = local_158.status.val | 0x40;
                    local_158.wait.val = local_158.wait.val & 0xfffffdff;
                    hal_task_hnd_set_status(local_188,0);
                    local_188 = (MppBuffer)0x0;
                  }
                  if ((local_158.wait.val & 0x80) != 0) {
                    MVar8 = hal_task_check_empty(pMVar2->tasks,1);
                    if (MVar8 != MPP_OK) goto LAB_0014784a;
                    local_158.wait.val = local_158.wait.val & 0xffffff7f;
                  }
                  if (((byte)mpp_dec_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_dec","detail: %p check prev task pass\n","try_proc_dec_task",
                               pMVar2);
                  }
                  if (((Mpp *)data)->mFrmOut != (mpp_list *)0x0) {
                    RVar10 = mpp_list::list_size(((Mpp *)data)->mFrmOut);
                    local_158.wait.val._0_2_ =
                         ((ushort)local_158.wait.val & 0xfffd) + (ushort)(4 < RVar10) * 2;
                    if (4 < RVar10) goto LAB_0014784a;
                  }
                  if (((byte)mpp_dec_debug & 0x20) != 0) {
                    _mpp_log_l(4,"mpp_dec","detail: %p check mframes pass\n","try_proc_dec_task",
                               pMVar2);
                  }
                  RVar10 = mpp_slots_get_unused_count(local_180);
                  local_158.wait.val._0_2_ =
                       (ushort)local_158.wait.val & 0xbfff | (ushort)(RVar10 == 0) << 0xe;
                  if (RVar10 != 0) {
                    if ((local_158.status.val & 0x200) == 0) {
                      mpp_clock_start(pMVar2->clocks[4]);
                      mpp_parser_parse(pMVar2->parser,&local_158.info.dec);
                      mpp_clock_pause(pMVar2->clocks[4]);
                      local_158.status.val = local_158.status.val | 0x200;
                    }
                    if ((local_158.info.dec.output < 0) || (local_158.info.dec.valid == 0)) {
                      if (((ulong)local_158.info.dec.flags & 1) == 0) {
                        hal_task_hnd_set_status(local_158.hnd,0);
                        local_158.hnd = (HalTaskHnd)0x0;
                      }
                      else {
                        mpp_dec_put_task((Mpp *)data,&local_158);
                      }
                      if ((local_158.status.val & 0x20) != 0) {
                        mpp_buf_slot_clr_flag(local_178,local_158.info.dec.input,SLOT_HAL_INPUT);
                        local_158.status.val = local_158.status.val & 0xffffffdf;
                      }
                      local_158.status.val = local_158.status.val & 0xfffffcff;
                      dec_task_info_init(&local_158.info);
                    }
                    else {
                      if (((byte)mpp_dec_debug & 0x20) != 0) {
                        _mpp_log_l(4,"mpp_dec","detail: %p check output index pass\n",
                                   "try_proc_dec_task",pMVar2);
                      }
                      RVar11 = mpp_buf_slot_is_changed(local_180);
                      if (RVar11 != 0) {
                        if ((local_158.status.val & 0x80) == 0) {
                          uVar22 = local_158.info._8_4_;
                          local_158.info.dec.flags =
                               (HalDecTaskFlag)
                               ((ulong)local_158.info.dec.flags & 0xfffffffffffffffc | 2);
                          mpp_dec_put_task((Mpp *)data,&local_158);
                          local_158.info.dec.flags =
                               (HalDecTaskFlag)
                               ((ulong)local_158.info.dec.flags & 0xfffffffffffffffe |
                               (ulong)(uVar22 & 1));
                          local_158.status.val = local_158.status.val | 0x80;
                          goto LAB_0014784a;
                        }
                        pMVar2->info_updated = 0;
                      }
                      RVar11 = mpp_buf_slot_is_changed(local_180);
                      local_158.wait.val._0_2_ =
                           (ushort)local_158.wait.val & 0xffdf | (ushort)((RVar11 & 1) << 5);
                      if ((RVar11 & 1) == 0) {
                        local_158.status.val = local_158.status.val & 0xffffff7f;
                        local_158.info._8_8_ = local_158.info._8_8_ & 0xfffffffffffffffd;
                        if (local_158.hnd == (HalTaskHnd)0x0) {
                          in_stack_fffffffffffffe68 =
                               CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x23a);
                          _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                                     "task->hnd","try_proc_dec_task",in_stack_fffffffffffffe68);
                          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147948;
                        }
                        group_00 = local_98;
                        if (*local_98 == (MppBufferGroup)0x0) {
                          _mpp_log_l(4,"mpp_dec","mpp_dec use internal frame buffer group\n",
                                     (char *)0x0);
                          mpp_buffer_group_get
                                    (group_00,0x20001,MPP_BUFFER_INTERNAL,"mpp_dec",
                                     "try_proc_dec_task");
                        }
                        group = *group_00;
                        if (group != (MppBufferGroup)0x0) {
                          RVar10 = mpp_buffer_group_unused(group);
                          iVar20 = (uint)(pMVar2->vproc != (void *)0x0) * 2 + 1;
                          local_158.wait.val._0_2_ =
                               (ushort)local_158.wait.val & 0xffbf | (ushort)(RVar10 < iVar20) << 6;
                          if (RVar10 < iVar20) goto LAB_0014784a;
                        }
                        if (((byte)mpp_dec_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_dec","detail: %p check frame group count pass\n",
                                     "try_proc_dec_task",pMVar2);
                        }
                        index_00 = local_158.info.dec.output;
                        mpp_buf_slot_get_prop
                                  (local_180,local_158.info.dec.output,SLOT_BUFFER,&local_160);
                        pvVar3 = local_180;
                        if (local_160 == (void *)0x0) {
                          local_188 = (MppFrame)0x0;
                          local_178 = (MppBufSlots)CONCAT44(local_178._4_4_,index_00);
                          mpp_buf_slot_get_prop(local_180,index_00,SLOT_FRAME_PTR,&local_188);
                          sVar16 = mpp_buf_slot_get_size(pvVar3);
                          if ((local_188 != (MppFrame)0x0) &&
                             (RVar11 = mpp_frame_get_thumbnail_en(local_188), RVar11 == 2)) {
                            RVar11 = mpp_frame_get_width(local_188);
                            RVar12 = mpp_frame_get_height(local_188);
                            sVar16 = (size_t)((RVar12 >> 1) * (RVar11 >> 1) * 3 >> 1);
                          }
                          mpp_buffer_get_with_tag
                                    (*local_98,&local_160,sVar16,"mpp_dec","try_proc_dec_task");
                          index_00 = (RK_S32)local_178;
                          if (local_160 != (void *)0x0) {
                            mpp_buf_slot_set_prop(local_180,(RK_S32)local_178,SLOT_BUFFER,local_160)
                            ;
                          }
                        }
                        if (((byte)mpp_dec_debug & 0x20) != 0) {
                          _mpp_log_l(4,"mpp_dec","detail: %p check output buffer %p\n",
                                     "try_proc_dec_task",pMVar2,local_160);
                        }
                        local_188 = (MppFrame)0x0;
                        mpp_buf_slot_get_prop(local_180,index_00,SLOT_FRAME_PTR,&local_188);
                        MVar13 = mpp_frame_get_fmt(local_188);
                        if (((MVar13 & 0xc000000) != MPP_FMT_YUV420SP) &&
                           ((pMVar2->cfg).base.enable_hdr_meta != 0)) {
                          fill_hdr_meta_to_frame(local_188,pMVar2->coding);
                        }
                        if ((pMVar2->info_updated == 0) && (pMVar2->dev != (MppDev)0x0)) {
                          local_188 = (MppFrame)0x0;
                          mpp_buf_slot_get_prop(local_180,index_00,SLOT_FRAME_PTR,&local_188);
                          update_dec_hal_info(pMVar2,local_188);
                          pMVar2->info_updated = 1;
                        }
                        local_158.wait.val._0_2_ =
                             (ushort)local_158.wait.val & 0xfbff |
                             (ushort)(local_160 == (void *)0x0) << 10;
                        if (local_160 != (void *)0x0) {
                          if ((pMVar2->cfg).base.sort_pts != 0) {
                            local_188 = (MppBuffer)0x0;
                            plVar17 = (list_head *)
                                      mpp_mem_pool_get_f("try_proc_dec_task",pMVar2->ts_pool);
                            if (plVar17 == (list_head *)0x0) {
                              in_stack_fffffffffffffe68 =
                                   CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x28d);
                              _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,
                                         "pkt_ts","try_proc_dec_task",in_stack_fffffffffffffe68);
                              if ((mpp_debug._3_1_ & 0x10) != 0) {
LAB_00147948:
                                abort();
                              }
                            }
                            mpp_buf_slot_get_prop(local_180,index_00,SLOT_FRAME_PTR,&local_188);
                            plVar17[1].next = (list_head *)local_158.ts_cur.pts;
                            plVar17[1].prev = (list_head *)local_158.ts_cur.dts;
                            plVar17->next = plVar17;
                            plVar17->prev = plVar17;
                            if ((local_188 != (MppFrame)0x0) &&
                               (plVar18 = (list_head *)mpp_frame_get_pts(local_188),
                               plVar18 == plVar17[1].next)) {
                              mpp_spinlock_lock(&pMVar2->ts_lock);
                              plVar18 = (pMVar2->ts_link).prev;
                              (pMVar2->ts_link).prev = plVar17;
                              plVar17->next = &pMVar2->ts_link;
                              plVar17->prev = plVar18;
                              plVar18->next = plVar17;
                              list_sort((void *)0x0,&pMVar2->ts_link,ts_cmp);
                              mpp_spinlock_unlock(&pMVar2->ts_lock);
                            }
                          }
                          mpp_clock_start(pMVar2->clocks[5]);
                          task_00 = &local_158.info;
                          mpp_hal_reg_gen(pMVar2->hal,task_00);
                          mpp_clock_pause(pMVar2->clocks[5]);
                          mpp_clock_start(pMVar2->clocks[6]);
                          mpp_hal_hw_start(pMVar2->hal,task_00);
                          mpp_clock_pause(pMVar2->clocks[6]);
                          mpp_dec_put_task((Mpp *)data,&local_158);
                          uVar19 = (ushort)((local_158.info._8_4_ & 0x20) << 2);
                          if (pMVar2->parser_fast_mode == 0) {
                            uVar19 = 0;
                          }
                          local_158.wait.val._0_2_ = (ushort)local_158.wait.val & 0xff7f | uVar19;
                          local_158.status.val = local_158.status.val & 0xfffffc9f;
                          dec_task_info_init(task_00);
                          if (((byte)mpp_dec_debug & 0x20) != 0) {
                            _mpp_log_l(4,"mpp_dec","detail: %p one task ready\n","try_proc_dec_task"
                                       ,pMVar2);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_0014784a:
          mpp_clock_pause(dec->clocks[2]);
          __mutex_00 = local_88;
        }
        else {
          pMVar2 = (MppDecImpl *)((Mpp *)data)->mDec;
          pMVar23 = pMVar2->thread_hal;
          pvVar3 = pMVar2->frame_slots;
          pvVar4 = pMVar2->tasks;
          local_178 = pMVar2->packet_slots;
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: parser reset start\n",(char *)0x0);
          }
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: parser wait hal proc reset start\n",(char *)0x0);
          }
          dec_release_task_in_port(((Mpp *)data)->mMppInPort);
          if (pMVar23 == (MppThread *)0x0) {
            in_stack_fffffffffffffe68 = CONCAT44((int)(in_stack_fffffffffffffe68 >> 0x20),0x94);
            _mpp_log_l(2,"mpp_dec","Assertion %s failed at %s:%d\n",(char *)0x0,"hal",
                       "reset_parser_thread",in_stack_fffffffffffffe68);
            if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_00147948;
          }
          pthread_mutex_lock((pthread_mutex_t *)pMVar23->mMutexCond);
          pMVar2->hal_reset_post = pMVar2->hal_reset_post + 1;
          pthread_cond_signal((pthread_cond_t *)&pMVar23->mMutexCond[0].mCondition);
          pthread_mutex_unlock((pthread_mutex_t *)pMVar23->mMutexCond);
          sem_wait((sem_t *)&pMVar2->hal_reset);
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: parser check hal proc task empty start\n",(char *)0x0);
          }
          MVar8 = hal_task_check_empty(pvVar4,1);
          data = local_80;
          if ((MVar8 != MPP_OK) &&
             (_mpp_log_l(2,"mpp_dec","found task not processed put %d get %d\n",
                         "reset_parser_thread",(ulong)local_80->mTaskPutCount,
                         (ulong)local_80->mTaskGetCount), (mpp_debug._3_1_ & 0x10) != 0))
          goto LAB_00147948;
          pMVar23 = local_90;
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: parser check hal proc task empty done\n",(char *)0x0);
          }
          local_158.status.val = local_158.status.val & 0xfffffebf | 0x40;
          local_158.info.dec.valid = 0;
          mpp_parser_reset(pMVar2->parser);
          mpp_hal_reset(pMVar2->hal);
          if (pMVar2->vproc != (void *)0x0) {
            if (((byte)mpp_dec_debug & 0x40) != 0) {
              _mpp_log_l(4,"mpp_dec","reset: vproc reset start\n",(char *)0x0);
            }
            dec_vproc_reset(pMVar2->vproc);
            if (((byte)mpp_dec_debug & 0x40) != 0) {
              _mpp_log_l(4,"mpp_dec","reset: vproc reset done\n",(char *)0x0);
            }
          }
          if ((local_158.status.val & 0x200) != 0) {
            _mpp_log_l(4,"mpp_dec","task no send to hal que must clr current frame hal status\n",
                       (char *)0x0);
            if (-1 < local_158.info.dec.output) {
              mpp_buf_slot_clr_flag(pvVar3,local_158.info.dec.output,SLOT_HAL_OUTPUT);
            }
            lVar21 = 0;
            do {
              RVar10 = *(RK_S32 *)((long)&local_158.info + lVar21 * 4 + 0x38);
              local_170 = (MppPacket)CONCAT44(local_170._4_4_,RVar10);
              if (-1 < RVar10) {
                mpp_buf_slot_clr_flag(pvVar3,RVar10,SLOT_HAL_INPUT);
              }
              lVar21 = lVar21 + 1;
            } while (lVar21 != 0x11);
            local_158.status.val = local_158.status.val & 0xfffffdff;
          }
          dec_release_input_packet(pMVar2,1);
          while (MVar8 = mpp_buf_slot_dequeue(pvVar3,(RK_S32 *)&local_170,QUEUE_DISPLAY),
                MVar8 == MPP_OK) {
            local_188 = (MppBuffer)0x0;
            mpp_buf_slot_get_prop(pvVar3,(RK_S32)local_170,SLOT_BUFFER,&local_188);
            if (local_188 != (MppBuffer)0x0) {
              mpp_buffer_put_with_caller(local_188,"reset_parser_thread");
            }
            mpp_buf_slot_clr_flag(pvVar3,(RK_S32)local_170,SLOT_QUEUE_USE);
          }
          if ((pMVar2->cfg).base.sort_pts != 0) {
            mpp_spinlock_lock(&pMVar2->ts_lock);
            plVar17 = (pMVar2->ts_link).next;
            while (plVar17 != &pMVar2->ts_link) {
              plVar18 = plVar17->next;
              plVar5 = plVar17->prev;
              plVar18->prev = plVar5;
              plVar5->next = plVar18;
              plVar17->next = plVar17;
              plVar17->prev = plVar17;
              mpp_mem_pool_put_f("reset_parser_thread",pMVar2->ts_pool,plVar17);
              plVar17 = plVar18;
            }
            mpp_spinlock_unlock(&pMVar2->ts_lock);
            data = local_80;
          }
          if ((local_158.status.val & 0x20) != 0) {
            mpp_buf_slot_clr_flag(local_178,local_158.info.dec.input,SLOT_HAL_INPUT);
            local_158.status.val = local_158.status.val & 0xffffffdf;
            local_158.info.dec.input = -1;
          }
          dec = local_68;
          __mutex_00 = local_88;
          if ((local_158.wait.val & 0x20) != 0) {
            _mpp_log_l(4,"mpp_dec","reset at info change\n",(char *)0x0);
          }
          local_158.status.val = local_158.status.val & 0xfffffdff;
          pMVar2->parser_status_flag = 0;
          pMVar2->parser_wait_flag = 0;
          dec_task_init(&local_158);
          if (((byte)mpp_dec_debug & 0x40) != 0) {
            _mpp_log_l(4,"mpp_dec","reset: parser reset all done\n",(char *)0x0);
          }
          __mutex = local_58;
          pthread_mutex_lock(local_58);
          dec->reset_flag = 0;
          sem_post(local_60);
          pthread_mutex_unlock(__mutex);
        }
      }
      else {
        if (((byte)mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d cmd %08x\n","mpp_dec_parser_thread",
                     (ulong)dec->cmd_recv,(ulong)dec->cmd);
        }
        sem_wait(local_40);
        MVar8 = mpp_dec_proc_cfg(dec,dec->cmd,dec->param);
        *dec->cmd_ret = MVar8;
        uVar22 = dec->cmd_recv + 1;
        dec->cmd_recv = uVar22;
        if (((byte)mpp_dec_debug & 0x20) != 0) {
          _mpp_log_l(4,"mpp_dec","ctrl proc %d done send %d\n","mpp_dec_parser_thread",(ulong)uVar22
                     ,(ulong)dec->cmd_send);
        }
        dec->cmd = 0;
        *local_48 = (void *)0x0;
        local_48[1] = (MPP_RET *)0x0;
        sem_post(local_50);
      }
      pthread_mutex_lock(__mutex_00);
      MVar7 = MppThread::get_status(pMVar23,THREAD_WORK);
      bVar24 = MVar7 == MPP_THREAD_RUNNING;
    } while (bVar24);
  }
  pthread_mutex_unlock(__mutex_00);
LAB_00147884:
  mpp_clock_pause(dec->clocks[0]);
  if (((byte)mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec","mpp_dec_parser_thread is going to exit\n",(char *)0x0);
  }
  pvVar3 = local_70;
  if ((local_158.hnd != (HalTaskHnd)0x0) && (local_158.info.dec.valid != 0)) {
    mpp_buf_slot_set_flag(local_70,local_158.info.dec.input,SLOT_CODEC_READY);
    mpp_buf_slot_set_flag(pvVar3,local_158.info.dec.input,SLOT_HAL_INPUT);
    mpp_buf_slot_clr_flag(pvVar3,local_158.info.dec.input,SLOT_HAL_INPUT);
  }
  mpp_buffer_group_clear(((Mpp *)data)->mPacketGroup);
  dec_release_task_in_port(((Mpp *)data)->mMppInPort);
  if (((byte)mpp_debug & 4) != 0) {
    _mpp_log_l(4,"mpp_dec","mpp_dec_parser_thread exited\n",(char *)0x0);
  }
  return (void *)0x0;
}

Assistant:

void *mpp_dec_parser_thread(void *data)
{
    Mpp *mpp = (Mpp*)data;
    MppDecImpl *dec = (MppDecImpl *)mpp->mDec;
    MppThread *parser = dec->thread_parser;
    MppBufSlots packet_slots = dec->packet_slots;

    DecTask task;
    HalDecTask  *task_dec = &task.info.dec;

    dec_task_init(&task);

    mpp_clock_start(dec->clocks[DEC_PRS_TOTAL]);

    while (1) {
        {
            AutoMutex autolock(parser->mutex());
            if (MPP_THREAD_RUNNING != parser->get_status())
                break;

            /*
             * parser thread need to wait at cases below:
             * 1. no task slot for output
             * 2. no packet for parsing
             * 3. info change on progress
             * 3. no buffer on analyzing output task
             */
            if (check_task_wait(dec, &task)) {
                mpp_clock_start(dec->clocks[DEC_PRS_WAIT]);
                parser->wait();
                mpp_clock_pause(dec->clocks[DEC_PRS_WAIT]);
            }
        }

        // process user control
        if (dec->cmd_send != dec->cmd_recv) {
            dec_dbg_detail("ctrl proc %d cmd %08x\n", dec->cmd_recv, dec->cmd);
            sem_wait(&dec->cmd_start);
            *dec->cmd_ret = mpp_dec_proc_cfg(dec, dec->cmd, dec->param);
            dec->cmd_recv++;
            dec_dbg_detail("ctrl proc %d done send %d\n", dec->cmd_recv,
                           dec->cmd_send);
            mpp_assert(dec->cmd_send == dec->cmd_send);
            dec->param = NULL;
            dec->cmd = (MpiCmd)0;
            dec->cmd_ret = NULL;
            sem_post(&dec->cmd_done);
            continue;
        }

        if (dec->reset_flag) {
            reset_parser_thread(mpp, &task);

            AutoMutex autolock(parser->mutex(THREAD_CONTROL));
            dec->reset_flag = 0;
            sem_post(&dec->parser_reset);
            continue;
        }

        // NOTE: ignore return value here is to fast response to reset.
        // Otherwise we can loop all dec task until it is failed.
        mpp_clock_start(dec->clocks[DEC_PRS_PROC]);
        try_proc_dec_task(mpp, &task);
        mpp_clock_pause(dec->clocks[DEC_PRS_PROC]);
    }

    mpp_clock_pause(dec->clocks[DEC_PRS_TOTAL]);

    mpp_dbg_info("mpp_dec_parser_thread is going to exit\n");
    if (task.hnd && task_dec->valid) {
        mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_CODEC_READY);
        mpp_buf_slot_set_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);
        mpp_buf_slot_clr_flag(packet_slots, task_dec->input, SLOT_HAL_INPUT);
    }
    mpp_buffer_group_clear(mpp->mPacketGroup);
    dec_release_task_in_port(mpp->mMppInPort);
    mpp_dbg_info("mpp_dec_parser_thread exited\n");
    return NULL;
}